

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,int64_t size,double value)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                  ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = double]");
  }
  uVar3 = size * size * 8;
  uVar2 = 0;
  pdVar1 = (double *)operator_new__(-(ulong)((ulong)(size * size) >> 0x3d != 0) | uVar3);
  do {
    *(double *)((long)pdVar1 + uVar2) = value;
    uVar2 = uVar2 + 8;
  } while (uVar3 != uVar2);
  (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar1;
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x35,
                "qclab::dense::SquareMatrix<double>::SquareMatrix(const int64_t, const T) [T = double]"
               );
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }